

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
          (polymorphic_allocator<pbrt::Image> *this,Image *p,Image *args)

{
  memory_resource *pmVar1;
  size_t sVar2;
  int iVar3;
  undefined1 auVar4 [16];
  
  (p->resolution).super_Tuple2<pbrt::Point2,_int>.y =
       (args->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  iVar3 = (args->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  p->format = args->format;
  (p->resolution).super_Tuple2<pbrt::Point2,_int>.x = iVar3;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&p->channelNames,&args->channelNames);
  (p->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar1 = (args->p8).alloc.memoryResource;
  (p->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (args->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (p->p8).alloc.memoryResource = pmVar1;
  auVar4 = ZEXT816(0) << 0x20;
  (p->p8).ptr = (uchar *)auVar4._0_8_;
  (p->p8).nAlloc = auVar4._8_8_;
  (p->p8).nStored = 0;
  sVar2 = (args->p8).nStored;
  (p->p8).nAlloc = (args->p8).nAlloc;
  (p->p8).nStored = sVar2;
  (p->p8).ptr = (args->p8).ptr;
  (args->p8).nStored = 0;
  (args->p8).ptr = (uchar *)auVar4._0_8_;
  (args->p8).nAlloc = auVar4._8_8_;
  (p->p16).alloc.memoryResource = (args->p16).alloc.memoryResource;
  (p->p16).nStored = 0;
  (p->p16).ptr = (Half *)auVar4._0_8_;
  (p->p16).nAlloc = auVar4._8_8_;
  sVar2 = (args->p16).nStored;
  (p->p16).nAlloc = (args->p16).nAlloc;
  (p->p16).nStored = sVar2;
  (p->p16).ptr = (args->p16).ptr;
  (args->p16).nStored = 0;
  (args->p16).ptr = (Half *)auVar4._0_8_;
  (args->p16).nAlloc = auVar4._8_8_;
  (p->p32).alloc.memoryResource = (args->p32).alloc.memoryResource;
  (p->p32).nStored = 0;
  (p->p32).ptr = (float *)auVar4._0_8_;
  (p->p32).nAlloc = auVar4._8_8_;
  sVar2 = (args->p32).nStored;
  (p->p32).nAlloc = (args->p32).nAlloc;
  (p->p32).nStored = sVar2;
  (p->p32).ptr = (args->p32).ptr;
  (args->p32).nStored = 0;
  (args->p32).ptr = (float *)auVar4._0_8_;
  (args->p32).nAlloc = auVar4._8_8_;
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }